

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Segment::AddGenericFrame(Segment *this,Frame *frame)

{
  ulong frame_timestamp_ns;
  uint64_t uVar1;
  Track **ppTVar2;
  Cluster *this_00;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Frame *pFVar6;
  Track *pTVar7;
  long lVar8;
  
  if (frame == (Frame *)0x0) {
    return false;
  }
  bVar3 = CheckHeaderInfo(this);
  if (!bVar3) {
    return false;
  }
  frame_timestamp_ns = frame->timestamp_;
  if (frame_timestamp_ns < this->last_timestamp_) {
    return false;
  }
  lVar5 = (long)(int)(this->tracks_).track_entries_size_;
  if (lVar5 < 1) {
    return false;
  }
  uVar1 = frame->track_number_;
  lVar8 = 0;
  do {
    pTVar7 = (this->tracks_).track_entries_[lVar8];
    if (pTVar7->number_ == uVar1) goto LAB_00155fcf;
    lVar8 = lVar8 + 1;
  } while (lVar5 != lVar8);
  pTVar7 = (Track *)0x0;
LAB_00155fcf:
  if (pTVar7 == (Track *)0x0) {
    return false;
  }
  if (frame->discard_padding_ != 0) {
    this->doc_type_version_ = 4;
  }
  if ((0 < (long)this->cluster_list_size_) &&
     (0x7fff < frame_timestamp_ns / (this->segment_info_).timecode_scale_ -
               this->cluster_list_[(long)this->cluster_list_size_ + -1]->timecode_)) {
    this->force_new_cluster_ = true;
  }
  if (this->has_video_ == true) {
    ppTVar2 = (this->tracks_).track_entries_;
    pTVar7 = *ppTVar2;
    if (pTVar7->number_ != uVar1) {
      lVar5 = 1;
      do {
        pTVar7 = ppTVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (pTVar7->number_ != uVar1);
    }
    if ((pTVar7->type_ == 2) && (this->force_new_cluster_ == false)) {
      pFVar6 = (Frame *)operator_new(0x68,(nothrow_t *)&std::nothrow);
      if (pFVar6 == (Frame *)0x0) {
        pFVar6 = (Frame *)0x0;
      }
      else {
        Frame::Frame(pFVar6);
      }
      if (pFVar6 == (Frame *)0x0) {
        return false;
      }
      bVar3 = Frame::CopyFrom(pFVar6,frame);
      if ((bVar3) && (bVar3 = QueueFrame(this,pFVar6), bVar3)) {
        this->track_frames_written_[frame->track_number_ - 1] =
             this->track_frames_written_[frame->track_number_ - 1] + 1;
        return true;
      }
      Frame::~Frame(pFVar6);
      operator_delete(pFVar6);
      return false;
    }
  }
  bVar3 = DoNewClusterProcessing(this,uVar1,frame_timestamp_ns,frame->is_key_);
  if (!bVar3) {
    return false;
  }
  if ((long)this->cluster_list_size_ < 1) {
    return false;
  }
  this_00 = this->cluster_list_[(long)this->cluster_list_size_ + -1];
  if (this_00 == (Cluster *)0x0) {
    return false;
  }
  if ((((frame->additional_ == (uint8_t *)0x0) && (frame->discard_padding_ == 0)) &&
      (frame->duration_ == 0)) ||
     ((frame->is_key_ != false || (frame->reference_block_timestamp_set_ != false)))) {
    bVar3 = false;
    goto LAB_001560c4;
  }
  pFVar6 = (Frame *)operator_new(0x68,(nothrow_t *)&std::nothrow);
  if (pFVar6 == (Frame *)0x0) {
    pFVar6 = (Frame *)0x0;
  }
  else {
    Frame::Frame(pFVar6);
  }
  if (pFVar6 == (Frame *)0x0) {
LAB_0015622b:
    bVar3 = false;
  }
  else {
    bVar3 = Frame::CopyFrom(pFVar6,frame);
    if (!bVar3) {
      Frame::~Frame(pFVar6);
      operator_delete(pFVar6);
      goto LAB_0015622b;
    }
    pFVar6->reference_block_timestamp_ = this->last_track_timestamp_[frame->track_number_ - 1];
    pFVar6->reference_block_timestamp_set_ = true;
    bVar3 = true;
    frame = pFVar6;
  }
  if (!bVar3) {
    return false;
  }
LAB_001560c4:
  bVar4 = Cluster::QueueOrWriteFrame(this_00,frame);
  if ((bVar4) &&
     (((this->new_cuepoint_ != true || (this->cues_track_ != frame->track_number_)) ||
      (bVar4 = AddCuePoint(this,frame->timestamp_,this->cues_track_), bVar4)))) {
    uVar1 = frame->timestamp_;
    this->last_timestamp_ = uVar1;
    this->last_track_timestamp_[frame->track_number_ - 1] = uVar1;
    this->last_block_duration_ = frame->duration_;
    this->track_frames_written_[frame->track_number_ - 1] =
         this->track_frames_written_[frame->track_number_ - 1] + 1;
    if (bVar3) {
      Frame::~Frame(frame);
      operator_delete(frame);
      return true;
    }
    return true;
  }
  return false;
}

Assistant:

bool Segment::AddGenericFrame(const Frame* frame) {
  if (!frame)
    return false;

  if (!CheckHeaderInfo())
    return false;

  // Check for non-monotonically increasing timestamps.
  if (frame->timestamp() < last_timestamp_)
    return false;

  // Check if the track number is valid.
  if (!tracks_.GetTrackByNumber(frame->track_number()))
    return false;

  if (frame->discard_padding() != 0)
    doc_type_version_ = 4;

  if (cluster_list_size_ > 0) {
    const uint64_t timecode_scale = segment_info_.timecode_scale();
    const uint64_t frame_timecode = frame->timestamp() / timecode_scale;

    const Cluster* const last_cluster = cluster_list_[cluster_list_size_ - 1];
    const uint64_t last_cluster_timecode = last_cluster->timecode();

    const uint64_t rel_timecode = frame_timecode - last_cluster_timecode;
    if (rel_timecode > kMaxBlockTimecode) {
      force_new_cluster_ = true;
    }
  }

  // If the segment has a video track hold onto audio frames to make sure the
  // audio that is associated with the start time of a video key-frame is
  // muxed into the same cluster.
  if (has_video_ && tracks_.TrackIsAudio(frame->track_number()) &&
      !force_new_cluster_) {
    Frame* const new_frame = new (std::nothrow) Frame();
    if (!new_frame || !new_frame->CopyFrom(*frame)) {
      delete new_frame;
      return false;
    }
    if (!QueueFrame(new_frame)) {
      delete new_frame;
      return false;
    }
    track_frames_written_[frame->track_number() - 1]++;
    return true;
  }

  if (!DoNewClusterProcessing(frame->track_number(), frame->timestamp(),
                              frame->is_key())) {
    return false;
  }

  if (cluster_list_size_ < 1)
    return false;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  // If the Frame is not a SimpleBlock, then set the reference_block_timestamp
  // if it is not set already.
  bool frame_created = false;
  if (!frame->CanBeSimpleBlock() && !frame->is_key() &&
      !frame->reference_block_timestamp_set()) {
    Frame* const new_frame = new (std::nothrow) Frame();
    if (!new_frame || !new_frame->CopyFrom(*frame)) {
      delete new_frame;
      return false;
    }
    new_frame->set_reference_block_timestamp(
        last_track_timestamp_[frame->track_number() - 1]);
    frame = new_frame;
    frame_created = true;
  }

  if (!cluster->AddFrame(frame))
    return false;

  if (new_cuepoint_ && cues_track_ == frame->track_number()) {
    if (!AddCuePoint(frame->timestamp(), cues_track_))
      return false;
  }

  last_timestamp_ = frame->timestamp();
  last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
  last_block_duration_ = frame->duration();
  track_frames_written_[frame->track_number() - 1]++;

  if (frame_created)
    delete frame;
  return true;
}